

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O3

int stbi_write_hdr_core(stbi__write_context *s,int x,int y,int comp,float *data)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  char cVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  float *pfVar9;
  int iVar10;
  char *pcVar11;
  undefined8 *puVar12;
  void *pvVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  byte bVar18;
  uchar rgbe [4];
  uchar scanlineheader [4];
  char header [66];
  char buffer [128];
  undefined1 local_1a6;
  char local_1a5;
  uchar local_1a4;
  undefined1 local_1a3;
  undefined1 local_1a2;
  undefined1 local_1a1;
  undefined4 local_1a0;
  uint local_19c;
  ulong local_198;
  ulong local_190;
  undefined8 local_188;
  float local_180;
  uint local_178;
  uint local_174;
  int local_170;
  uint local_16c;
  long local_168;
  void *local_160;
  void *local_158;
  float *local_150;
  ulong local_148;
  long local_140;
  long local_138;
  long local_130;
  long local_128;
  void *local_120;
  long local_118;
  long local_110;
  undefined8 local_108 [8];
  undefined2 local_c8;
  char local_b8 [136];
  
  bVar18 = 0;
  iVar2 = 0;
  if (data != (float *)0x0 && (0 < x && 0 < y)) {
    local_150 = data;
    pvVar4 = malloc((ulong)(uint)(x * 4));
    pcVar11 = "#?RADIANCE\n# Written by stb_image_write.h\nFORMAT=32-bit_rle_rgbe\n";
    puVar12 = local_108;
    for (lVar6 = 8; lVar6 != 0; lVar6 = lVar6 + -1) {
      *puVar12 = *(undefined8 *)pcVar11;
      pcVar11 = pcVar11 + ((ulong)bVar18 * -2 + 1) * 8;
      puVar12 = puVar12 + (ulong)bVar18 * -2 + 1;
    }
    local_c8 = 10;
    (*s->func)(s->context,local_108,0x41);
    iVar2 = sprintf(local_b8,"EXPOSURE=          1.0000000000000\n\n-Y %d +X %d\n",(ulong)(uint)y,
                    (ulong)(uint)x);
    uVar8 = 0;
    (*s->func)(s->context,local_b8,iVar2);
    local_170 = comp * x;
    local_174 = (uint)x >> 8;
    local_178 = x - 0x8000;
    local_19c = comp - 3;
    local_198 = (ulong)(uint)x;
    local_138 = local_198 + (long)pvVar4;
    local_128 = (ulong)(uint)(x * 2) + (long)pvVar4;
    local_130 = (ulong)(uint)(x * 3) + (long)pvVar4;
    lVar6 = local_198 - 3;
    local_140 = -local_198;
    local_168 = (long)comp << 2;
    local_190 = (ulong)(uint)x;
    local_16c = y;
    local_120 = pvVar4;
    local_110 = lVar6;
    do {
      uVar7 = local_19c;
      uVar3 = ~(uint)uVar8 + local_16c;
      if (stbi__flip_vertically_on_write == 0) {
        uVar3 = (uint)uVar8;
      }
      pfVar9 = local_150 + (int)(uVar3 * local_170);
      local_1a0 = CONCAT13((char)local_190,CONCAT12((char)local_174,0x202));
      uVar14 = local_198;
      local_148 = uVar8;
      if (local_178 < 0xffff8008) {
        do {
          if (local_19c < 2) {
            local_180 = pfVar9[2];
            local_188 = *(undefined8 *)pfVar9;
          }
          else {
            local_180 = *pfVar9;
            local_188 = CONCAT44(local_180,local_180);
          }
          stbiw__linear_to_rgbe(&local_1a4,(float *)&local_188);
          (*s->func)(s->context,&local_1a4,4);
          pfVar9 = (float *)((long)pfVar9 + local_168);
          uVar14 = uVar14 - 1;
          pvVar13 = pvVar4;
        } while (uVar14 != 0);
      }
      else {
        lVar15 = 0;
        do {
          if (uVar7 < 2) {
            local_180 = pfVar9[2];
            local_188 = *(undefined8 *)pfVar9;
          }
          else {
            local_180 = *pfVar9;
            local_188 = CONCAT44(local_180,local_180);
          }
          stbiw__linear_to_rgbe(&local_1a4,(float *)&local_188);
          *(uchar *)((long)pvVar4 + lVar15) = local_1a4;
          *(undefined1 *)(local_138 + lVar15) = local_1a3;
          *(undefined1 *)(local_128 + lVar15) = local_1a2;
          *(undefined1 *)(local_130 + lVar15) = local_1a1;
          lVar15 = lVar15 + 1;
          pfVar9 = (float *)((long)pfVar9 + local_168);
        } while (local_140 + lVar15 != 0);
        (*s->func)(s->context,&local_1a0,4);
        lVar15 = 0;
        pvVar13 = pvVar4;
        do {
          pvVar13 = (void *)(lVar15 * local_198 + (long)pvVar13);
          iVar2 = 0;
          local_160 = pvVar4;
          local_158 = pvVar13;
          local_118 = lVar15;
          do {
            iVar10 = (int)local_190;
            iVar17 = iVar10;
            if (iVar2 + 2 < iVar10) {
              lVar15 = (long)iVar2 + -1;
              cVar5 = *(char *)((long)pvVar13 + (long)iVar2);
              iVar16 = iVar2;
              do {
                cVar1 = *(char *)((long)local_160 + lVar15 + 2);
                if ((cVar5 == cVar1) &&
                   (iVar17 = iVar16, cVar5 == *(char *)((long)local_160 + lVar15 + 3))) break;
                iVar16 = iVar16 + 1;
                lVar15 = lVar15 + 1;
                cVar5 = cVar1;
                iVar17 = iVar10;
              } while (lVar15 < lVar6);
            }
            for (; iVar2 < iVar17; iVar2 = iVar2 + iVar10) {
              iVar10 = iVar17 - iVar2;
              if (0x7f < iVar10) {
                iVar10 = 0x80;
              }
              local_1a6 = (undefined1)iVar10;
              (*s->func)(s->context,&local_1a6,1);
              (*s->func)(s->context,(void *)((long)pvVar13 + (long)iVar2),iVar10);
              pvVar13 = local_158;
            }
            iVar10 = (int)local_190;
            if (iVar17 + 2 < iVar10) {
              lVar6 = (long)iVar17;
              iVar16 = iVar17 + 1;
              if (iVar17 + 1 < iVar10) {
                iVar16 = iVar10;
              }
              do {
                if (*(char *)((long)local_160 + lVar6) != *(char *)((long)pvVar13 + (long)iVar2)) {
                  iVar16 = (int)lVar6;
                  break;
                }
                lVar6 = lVar6 + 1;
              } while (lVar6 < (long)local_198);
              if (iVar2 < iVar16) {
                do {
                  iVar17 = iVar16 - iVar2;
                  if (0x7e < iVar16 - iVar2) {
                    iVar17 = 0x7f;
                  }
                  local_1a6 = *(undefined1 *)((long)pvVar13 + (long)iVar2);
                  local_1a5 = (char)iVar17 + -0x80;
                  (*s->func)(s->context,&local_1a5,1);
                  (*s->func)(s->context,&local_1a6,1);
                  iVar2 = iVar2 + iVar17;
                  pvVar13 = local_158;
                } while (iVar2 < iVar16);
              }
            }
            lVar6 = local_110;
          } while (iVar2 < (int)local_190);
          lVar15 = local_118 + 1;
          pvVar4 = (void *)((long)local_160 + local_198);
          pvVar13 = local_120;
        } while (lVar15 != 4);
      }
      uVar7 = (int)local_148 + 1;
      uVar8 = (ulong)uVar7;
      pvVar4 = pvVar13;
    } while (uVar7 != local_16c);
    free(pvVar13);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int stbi_write_hdr_core(stbi__write_context *s, int x, int y, int comp, float *data)
{
   if (y <= 0 || x <= 0 || data == NULL)
      return 0;
   else {
      // Each component is stored separately. Allocate scratch space for full output scanline.
      unsigned char *scratch = (unsigned char *) STBIW_MALLOC(x*4);
      int i, len;
      char buffer[128];
      char header[] = "#?RADIANCE\n# Written by stb_image_write.h\nFORMAT=32-bit_rle_rgbe\n";
      s->func(s->context, header, sizeof(header)-1);

#ifdef __STDC_WANT_SECURE_LIB__
      len = sprintf_s(buffer, sizeof(buffer), "EXPOSURE=          1.0000000000000\n\n-Y %d +X %d\n", y, x);
#else
      len = sprintf(buffer, "EXPOSURE=          1.0000000000000\n\n-Y %d +X %d\n", y, x);
#endif
      s->func(s->context, buffer, len);

      for(i=0; i < y; i++)
         stbiw__write_hdr_scanline(s, x, comp, scratch, data + comp*x*(stbi__flip_vertically_on_write ? y-1-i : i));
      STBIW_FREE(scratch);
      return 1;
   }
}